

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O0

char * vkt::sr::anon_unknown_0::getDerivateFuncCaseName(DerivateFunc func)

{
  char *pcStack_10;
  DerivateFunc func_local;
  
  switch(func) {
  case DERIVATE_DFDX:
    pcStack_10 = "dfdx";
    break;
  case DERIVATE_DFDXFINE:
    pcStack_10 = "dfdxfine";
    break;
  case DERIVATE_DFDXCOARSE:
    pcStack_10 = "dfdxcoarse";
    break;
  case DERIVATE_DFDY:
    pcStack_10 = "dfdy";
    break;
  case DERIVATE_DFDYFINE:
    pcStack_10 = "dfdyfine";
    break;
  case DERIVATE_DFDYCOARSE:
    pcStack_10 = "dfdycoarse";
    break;
  case DERIVATE_FWIDTH:
    pcStack_10 = "fwidth";
    break;
  case DERIVATE_FWIDTHFINE:
    pcStack_10 = "fwidthfine";
    break;
  case DERIVATE_FWIDTHCOARSE:
    pcStack_10 = "fwidthcoarse";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static const char* getDerivateFuncCaseName (DerivateFunc func)
{
	switch (func)
	{
		case DERIVATE_DFDX:				return "dfdx";
		case DERIVATE_DFDXFINE:			return "dfdxfine";
		case DERIVATE_DFDXCOARSE:		return "dfdxcoarse";
		case DERIVATE_DFDY:				return "dfdy";
		case DERIVATE_DFDYFINE:			return "dfdyfine";
		case DERIVATE_DFDYCOARSE:		return "dfdycoarse";
		case DERIVATE_FWIDTH:			return "fwidth";
		case DERIVATE_FWIDTHFINE:		return "fwidthfine";
		case DERIVATE_FWIDTHCOARSE:		return "fwidthcoarse";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}